

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall delta_complex_t::add_edge(delta_complex_t *this,index_t i,index_t j,value_t val)

{
  pointer pvVar1;
  pointer pvVar2;
  long _loc;
  index_t _loc_00;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  allocator_type local_209;
  index_t loc;
  value_t local_1fc;
  index_t local_1f8;
  index_t local_1f0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orient;
  index_t j_local;
  index_t i_local;
  _Vector_base<long,_std::allocator<long>_> local_1c0;
  _Vector_base<long,_std::allocator<long>_> local_1a8;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_190;
  _Vector_base<long,_std::allocator<long>_> local_178;
  _Vector_base<long,_std::allocator<long>_> local_160;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_148;
  _Vector_base<long,_std::allocator<long>_> local_130;
  delta_complex_cell_t local_118;
  
  pvVar1 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  loc = ((long)*(pointer *)
                ((long)&pvVar1[1].
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        ._M_impl + 8) -
        *(long *)&pvVar1[1].
                  super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                  _M_impl) / 0xe8;
  new_orient.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_orient.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_orient.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1fc = val;
  j_local = j;
  i_local = i;
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::emplace_back<std::vector<long,std::allocator<long>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&new_orient,&local_118.coboundary);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_118);
  if (i < j) {
    local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (new_orient.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(long *)&local_118);
    pvVar1 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __l._M_len = 2;
    __l._M_array = &local_1f8;
    local_1f8 = i;
    local_1f0 = j;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_130,__l,&local_209);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector(&local_148,&new_orient);
    delta_complex_cell_t::delta_complex_cell_t
              (&local_118,(vector<long,_std::allocator<long>_> *)&local_130,&local_148,local_1fc,loc
              );
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(pvVar1 + 1,&local_118);
    delta_complex_cell_t::~delta_complex_cell_t(&local_118);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_148);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_130);
    pvVar2 = (this->cliques).
             super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _loc = ((long)*(pointer *)
                   ((long)&pvVar2[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl
                           .super__Vector_impl_data + 8) -
           *(long *)&pvVar2[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                     super__Vector_impl_data) / 0x70;
    __l_00._M_len = 2;
    __l_00._M_array = &local_1f8;
    local_1f8 = i;
    local_1f0 = j;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_160,__l_00,&local_209);
    clique_t::clique_t((clique_t *)&local_118,(vector<long,_std::allocator<long>_> *)&local_160,_loc
                      );
    std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
              (pvVar2 + 1,(clique_t *)&local_118);
    clique_t::~clique_t((clique_t *)&local_118);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_160);
    std::vector<long,_std::allocator<long>_>::push_back
              (&(*(pointer *)
                  ((long)&(this->cliques).
                          super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                          super__Vector_impl_data + 8))[-1].faces,&loc);
    clique_t::add_coface
              ((clique_t *)
               (i * 0x70 +
               *(long *)&(((this->cliques).
                           super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<clique_t,_std::allocator<clique_t>_>)._M_impl.
                         super__Vector_impl_data),j,_loc);
  }
  else {
    local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (new_orient.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(long *)&local_118);
    pvVar1 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __l_01._M_len = 2;
    __l_01._M_array = &local_1f8;
    local_1f8 = j;
    local_1f0 = i;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_178,__l_01,&local_209);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector(&local_190,&new_orient);
    delta_complex_cell_t::delta_complex_cell_t
              (&local_118,(vector<long,_std::allocator<long>_> *)&local_178,&local_190,local_1fc,loc
              );
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(pvVar1 + 1,&local_118);
    delta_complex_cell_t::~delta_complex_cell_t(&local_118);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_190);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_178);
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&local_118;
    local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)j;
    local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)i;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_1a8,__l_02,(allocator_type *)&local_1f8
              );
    _loc_00 = get_clique(this,(vector<long,_std::allocator<long>_> *)&local_1a8);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_1a8);
    if (_loc_00 == -1) {
      pvVar2 = (this->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _loc_00 = ((long)*(pointer *)
                        ((long)&pvVar2[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar2[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                          super__Vector_impl_data) / 0x70;
      __l_03._M_len = 2;
      __l_03._M_array = &local_1f8;
      local_1f8 = j;
      local_1f0 = i;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)&local_1c0,__l_03,&local_209);
      clique_t::clique_t((clique_t *)&local_118,(vector<long,_std::allocator<long>_> *)&local_1c0,
                         _loc_00);
      std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
                (pvVar2 + 1,(clique_t *)&local_118);
      clique_t::~clique_t((clique_t *)&local_118);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_1c0);
      clique_t::add_coface
                ((clique_t *)
                 (j * 0x70 +
                 *(long *)&(((this->cliques).
                             super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<clique_t,_std::allocator<clique_t>_>)._M_impl.
                           super__Vector_impl_data),i,_loc_00);
    }
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)
               (_loc_00 * 0x70 +
               *(long *)&(this->cliques).
                         super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                         super__Vector_impl_data),&loc);
  }
  delta_complex_cell_t::add_neighbour
            ((delta_complex_cell_t *)
             (*(long *)&(((this->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        )._M_impl + i * 0xe8),j,0);
  delta_complex_cell_t::add_neighbour
            ((delta_complex_cell_t *)
             (*(long *)&(((this->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        )._M_impl + j * 0xe8),i,1);
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)
             (i * 0xe8 +
             *(long *)&(((this->cells).
                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                       )._M_impl),&loc);
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)
             (j * 0xe8 +
             *(long *)&(((this->cells).
                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                       )._M_impl),&loc);
  std::vector<long,_std::allocator<long>_>::push_back
            (&(*(pointer *)
                ((long)&(this->cells).
                        super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        ._M_impl + 8))[-1].boundary,&i_local);
  std::vector<long,_std::allocator<long>_>::push_back
            (&(*(pointer *)
                ((long)&(this->cells).
                        super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        ._M_impl + 8))[-1].boundary,&j_local);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&new_orient);
  return;
}

Assistant:

void add_edge(index_t i,index_t j,value_t val){
		//NOTE: We assume edges are added in increasing lexicographic order,
		//this avoids always checking if relevant 2-clique already in list
		//This could be changed and it would make the code easier to read,
		//But I think it is slightly faster this way, though probably a negligible amount
		index_t loc = cells[1].size();
		std::vector<std::vector<index_t>> new_orient;
		new_orient.push_back(std::vector<index_t>());
		if( i < j ){
			//When i < j create a new clique and a new face, with edge orientation 1
			//add the new face to the new clique and also add the cofaces to the clique
			new_orient[0].push_back(1);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{i,j},new_orient,val,loc));
			index_t cli_loc = cliques[1].size();
			cliques[1].push_back(clique_t(std::vector<index_t>{i,j},cli_loc));
			cliques[1].back().faces.push_back(loc);
			cliques[0][i].add_coface(j,cli_loc);
		} else{
			//When i > j  create a new face with orientation 0
			//then check if the clique already exists, if it does not then create it
			//then add the new face the the clique
			new_orient[0].push_back(0);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{j,i},new_orient,val,loc));
			index_t the_cli = get_clique(std::vector<index_t>{j,i});
			if(the_cli == -1){
				index_t cli_loc = cliques[1].size();
				cliques[1].push_back(clique_t(std::vector<index_t>{j,i},cli_loc));
				cliques[0][j].add_coface(i,cli_loc);
				the_cli = cli_loc;
			}
			cliques[1][the_cli].faces.push_back(loc);
		}
		//Add the relevent neighbour and coboundary information to the vertices
		cells[0][i].add_neighbour(j,0);
		cells[0][j].add_neighbour(i,1);
		cells[0][i].coboundary.push_back(loc);
		cells[0][j].coboundary.push_back(loc);
		//Add the vertices of faces of the new created face
		cells[1].back().boundary.push_back(i);
		cells[1].back().boundary.push_back(j);
	}